

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O2

string * __thiscall
absl::StrCat<std::__cxx11::string,char[30],std::__cxx11::string>
          (string *__return_storage_ptr__,absl *this,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d
          ,AlphaNum *e,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          char (*args_1) [30],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  undefined8 local_98;
  undefined8 uStack_90;
  size_t local_88;
  char *pcStack_80;
  size_t local_78;
  char *pcStack_70;
  size_t local_68;
  char *pcStack_60;
  size_t local_58;
  char *pcStack_50;
  char *local_48;
  size_t local_40;
  string_view local_38;
  size_type local_28;
  undefined8 local_20;
  
  local_98 = *(undefined8 *)this;
  uStack_90 = *(undefined8 *)(this + 8);
  local_88 = (a->piece_)._M_len;
  pcStack_80 = (a->piece_)._M_str;
  local_78 = (b->piece_)._M_len;
  pcStack_70 = (b->piece_)._M_str;
  local_68 = (c->piece_)._M_len;
  pcStack_60 = (c->piece_)._M_str;
  local_58 = (d->piece_)._M_len;
  pcStack_50 = (d->piece_)._M_str;
  local_40 = (e->piece_)._M_len;
  local_48 = (e->piece_)._M_str;
  local_38 = NullSafeStringView((Nullable<const_char_*>)args);
  local_20 = *(undefined8 *)*args_1;
  local_28 = *(size_type *)(*args_1 + 8);
  pieces._M_len = local_28;
  pieces._M_array = (iterator)0x8;
  strings_internal::CatPieces_abi_cxx11_
            (__return_storage_ptr__,(strings_internal *)&local_98,pieces);
  return __return_storage_ptr__;
}

Assistant:

ABSL_MUST_USE_RESULT inline std::string StrCat(
    const AlphaNum& a, const AlphaNum& b, const AlphaNum& c, const AlphaNum& d,
    const AlphaNum& e, const AV&... args) {
  return strings_internal::CatPieces(
      {a.Piece(), b.Piece(), c.Piece(), d.Piece(), e.Piece(),
       static_cast<const AlphaNum&>(args).Piece()...});
}